

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

bool __thiscall Tokenizer::processElement(Tokenizer *this,iterator *it)

{
  iterator iVar1;
  vector<Token,_std::allocator<Token>_> *this_00;
  bool bVar2;
  bool bVar3;
  reference pTVar4;
  Identifier *other;
  const_reference pvVar5;
  const_iterator __last;
  Identifier *other_00;
  size_type sVar6;
  reference pTVar7;
  pointer pTVar8;
  Token *token;
  const_iterator __end4;
  const_iterator __begin4;
  vector<Token,_std::allocator<Token>_> *__range4;
  iterator insertIt_1;
  Token originalToken;
  Token local_118;
  const_iterator local_b0;
  vector<Token,_std::allocator<Token>_> *local_a8;
  vector<Token,_std::allocator<Token>_> *replacement_1;
  _List_iterator<Token> local_98;
  iterator nextIt;
  size_t index;
  __normal_iterator<const_Token_*,_std::vector<Token,_std::allocator<Token>_>_> local_78;
  __normal_iterator<const_Token_*,_std::vector<Token,_std::allocator<Token>_>_> local_70;
  const_iterator local_68;
  _List_iterator<Token> local_60;
  iterator insertIt;
  Replacement *replacement;
  iterator __end3;
  iterator __begin3;
  vector<Tokenizer::Replacement,_std::allocator<Tokenizer::Replacement>_> *__range3;
  Identifier *identifier;
  iterator iStack_28;
  bool replaced;
  iterator *local_20;
  iterator *it_local;
  Tokenizer *this_local;
  
  local_20 = it;
  it_local = (iterator *)this;
  iStack_28 = std::__cxx11::list<Token,_std::allocator<Token>_>::end(&this->tokens);
  bVar2 = std::operator==(it,&stack0xffffffffffffffd8);
  if (bVar2) {
    this_local._7_1_ = false;
  }
  else {
LAB_00193ea3:
    pTVar4 = std::_List_iterator<Token>::operator*(local_20);
    if (((pTVar4->checked ^ 0xffU) & 1) != 0) {
      bVar2 = false;
      pTVar4 = std::_List_iterator<Token>::operator*(local_20);
      if (pTVar4->type == Identifier) goto code_r0x00193ed1;
      goto LAB_00194352;
    }
LAB_0019436a:
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
code_r0x00193ed1:
  pTVar4 = std::_List_iterator<Token>::operator*(local_20);
  other = Token::identifierValue(pTVar4);
  __end3 = std::vector<Tokenizer::Replacement,_std::allocator<Tokenizer::Replacement>_>::begin
                     (&this->replacements);
  replacement = (Replacement *)
                std::vector<Tokenizer::Replacement,_std::allocator<Tokenizer::Replacement>_>::end
                          (&this->replacements);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end3,(__normal_iterator<Tokenizer::Replacement_*,_std::vector<Tokenizer::Replacement,_std::allocator<Tokenizer::Replacement>_>_>
                                     *)&replacement), bVar3) {
    insertIt._M_node =
         (_List_node_base *)
         __gnu_cxx::
         __normal_iterator<Tokenizer::Replacement_*,_std::vector<Tokenizer::Replacement,_std::allocator<Tokenizer::Replacement>_>_>
         ::operator*(&__end3);
    bVar3 = Identifier::operator==((Identifier *)insertIt._M_node,other);
    if (bVar3) {
      local_60._M_node = local_20->_M_node;
      std::_List_iterator<Token>::operator++(&local_60);
      pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                         ((vector<Token,_std::allocator<Token>_> *)(insertIt._M_node + 2),0);
      pTVar4 = std::_List_iterator<Token>::operator*(local_20);
      Token::operator=(pTVar4,pvVar5);
      std::_List_const_iterator<Token>::_List_const_iterator(&local_68,&local_60);
      local_78._M_current =
           (Token *)std::vector<Token,_std::allocator<Token>_>::begin
                              ((vector<Token,_std::allocator<Token>_> *)(insertIt._M_node + 2));
      local_70 = __gnu_cxx::
                 __normal_iterator<const_Token_*,_std::vector<Token,_std::allocator<Token>_>_>::
                 operator+(&local_78,1);
      __last = std::vector<Token,_std::allocator<Token>_>::end
                         ((vector<Token,_std::allocator<Token>_> *)(insertIt._M_node + 2));
      std::__cxx11::list<Token,std::allocator<Token>>::
      insert<__gnu_cxx::__normal_iterator<Token_const*,std::vector<Token,std::allocator<Token>>>,void>
                ((list<Token,std::allocator<Token>> *)this,local_68,local_70,
                 (__normal_iterator<const_Token_*,_std::vector<Token,_std::allocator<Token>_>_>)
                 __last._M_current);
      pTVar4 = std::_List_iterator<Token>::operator*(local_20);
      if (pTVar4->type == Identifier) {
        pTVar4 = std::_List_iterator<Token>::operator*(local_20);
        other_00 = Token::identifierValue(pTVar4);
        bVar3 = Identifier::operator!=(other,other_00);
        if (!bVar3) break;
      }
      bVar2 = true;
      break;
    }
    __gnu_cxx::
    __normal_iterator<Tokenizer::Replacement_*,_std::vector<Tokenizer::Replacement,_std::allocator<Tokenizer::Replacement>_>_>
    ::operator++(&__end3);
  }
  if (!bVar2) {
    bVar2 = SymbolTable::findEquation
                      (&Global.symbolTable,other,Global.FileInfo.FileNum,Global.Section,
                       (size_t *)&nextIt);
    if (bVar2) {
      local_98._M_node = local_20->_M_node;
      std::advance<std::_List_iterator<Token>,int>(&local_98,1);
      replacement_1 =
           (vector<Token,_std::allocator<Token>_> *)
           std::__cxx11::list<Token,_std::allocator<Token>_>::end(&this->tokens);
      bVar3 = std::operator!=(&local_98,(_Self *)&replacement_1);
      bVar2 = false;
      if (bVar3) {
        pTVar8 = std::_List_iterator<Token>::operator->(&local_98);
        bVar2 = pTVar8->type == Equ;
      }
      if (bVar2) goto LAB_0019436a;
      local_a8 = std::
                 vector<std::vector<Token,_std::allocator<Token>_>,_std::allocator<std::vector<Token,_std::allocator<Token>_>_>_>
                 ::operator[](&equValues,(size_type)nextIt._M_node);
      std::_List_const_iterator<Token>::_List_const_iterator(&local_b0,&local_98);
      sVar6 = std::vector<Token,_std::allocator<Token>_>::size(local_a8);
      local_118.originalText.field_2._M_allocated_capacity = 0;
      local_118.originalText.field_2._8_8_ = 0;
      local_118.originalText._M_dataplus = (_Alloc_hider)0x0;
      local_118.originalText._1_7_ = 0;
      local_118.originalText._M_string_length = 0;
      local_118.value.super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
      super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
      super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
      super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
      super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
      super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>._M_u.
      _24_8_ = 0;
      local_118.value.super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
      super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
      super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
      super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
      super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
      super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>._M_index
           = '\0';
      local_118.value.super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
      super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
      super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
      super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
      super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
      super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>._33_7_ =
           0;
      local_118.value.super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
      super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
      super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
      super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
      super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
      super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>._M_u.
      _8_8_ = 0;
      local_118.value.super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
      super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
      super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
      super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
      super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
      super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>._M_u.
      _16_8_ = 0;
      local_118.type = Invalid;
      local_118.checked = false;
      local_118._21_3_ = 0;
      local_118.value.super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
      super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
      super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
      super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
      super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
      super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>._M_u.
      _M_rest._0_8_ = (undefined8)0;
      local_118.line = 0;
      local_118.column = 0;
      Token::Token(&local_118);
      std::__cxx11::list<Token,_std::allocator<Token>_>::insert
                (&this->tokens,local_b0,sVar6 - 1,&local_118);
      Token::~Token(&local_118);
      pTVar4 = std::_List_iterator<Token>::operator*(local_20);
      Token::Token((Token *)&insertIt_1,pTVar4);
      this_00 = local_a8;
      __range4 = (vector<Token,_std::allocator<Token>_> *)local_20->_M_node;
      __end4 = std::vector<Token,_std::allocator<Token>_>::begin(local_a8);
      token = (Token *)std::vector<Token,_std::allocator<Token>_>::end(this_00);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<const_Token_*,_std::vector<Token,_std::allocator<Token>_>_>
                                         *)&token), bVar2) {
        pTVar7 = __gnu_cxx::
                 __normal_iterator<const_Token_*,_std::vector<Token,_std::allocator<Token>_>_>::
                 operator*(&__end4);
        pTVar4 = std::_List_iterator<Token>::operator*((_List_iterator<Token> *)&__range4);
        Token::operator=(pTVar4,pTVar7);
        iVar1 = insertIt_1;
        pTVar8 = std::_List_iterator<Token>::operator->((_List_iterator<Token> *)&__range4);
        pTVar8->line = (size_t)iVar1._M_node;
        pTVar8 = std::_List_iterator<Token>::operator->((_List_iterator<Token> *)&__range4);
        pTVar8->column = originalToken.line;
        std::advance<std::_List_iterator<Token>,int>((_List_iterator<Token> *)&__range4,1);
        __gnu_cxx::__normal_iterator<const_Token_*,_std::vector<Token,_std::allocator<Token>_>_>::
        operator++(&__end4);
      }
      Token::~Token((Token *)&insertIt_1);
    }
    else {
LAB_00194352:
      pTVar4 = std::_List_iterator<Token>::operator*(local_20);
      pTVar4->checked = true;
    }
  }
  goto LAB_00193ea3;
}

Assistant:

bool Tokenizer::processElement(TokenList::iterator& it)
{
	if (it == tokens.end())
		return false;

	while (!(*it).checked)
	{
		bool replaced = false;
		if ((*it).type == TokenType::Identifier)
		{
			const Identifier &identifier = (*it).identifierValue();
			for (const Replacement& replacement: replacements)
			{
				// if the identifier matches, add all of its tokens
				if (replacement.identifier == identifier)
				{
					TokenList::iterator insertIt = it;
					++insertIt;
				
					// replace old token with the new tokens
					// replace the first token manually so that any iterators
					// are still guaranteed to be valid
					(*it) = replacement.value[0];
					tokens.insert(insertIt,replacement.value.begin()+1, replacement.value.end());

					// If the value at this position didn't change, then just keep going.
					// Otherwise we'd be stuck in an endless replace loop
					if ((*it).type != TokenType::Identifier || identifier != (*it).identifierValue())
						replaced = true;
					break;
				}
			}

			if (replaced)
				continue;

			// check for equs
			size_t index;
			if (Global.symbolTable.findEquation(identifier,Global.FileInfo.FileNum,Global.Section,index))
			{
				TokenList::iterator nextIt = it;
				std::advance(nextIt, 1);
			
				// check if this is another equ with the same name.
				// if so, keep equ redefinitions for later error handling
				if (nextIt != tokens.end() && nextIt->type == TokenType::Equ)
					break;

				// make room for the replacement tokens
				const std::vector<Token>& replacement = equValues[index];
				tokens.insert(nextIt, replacement.size()-1, {});

				// insert replacement tokens, while keeping the file info of the original token
				Token originalToken = *it;

				TokenList::iterator insertIt = it;
				for (const Token& token: replacement)
				{
					(*insertIt) = token;
					insertIt->line = originalToken.line;
					insertIt->column = originalToken.column;
					std::advance(insertIt, 1);
				}

				replaced = true;
				continue;
			}
		}

		if (!replaced)
			(*it).checked = true;
	}

	return true;
}